

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
V2Transport::GetMessageType_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,V2Transport *this,Span<const_unsigned_char> *contents)

{
  undefined8 *puVar1;
  byte bVar2;
  bool bVar3;
  _func_int **pp_Var4;
  ulong uVar5;
  long in_FS_OFFSET;
  string ret;
  undefined1 *local_48;
  size_type local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = *(ulong *)&(this->m_cipher).m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>
                     ._M_payload.super__Optional_payload<FSChaCha20,_true,_false,_false>.
                     super__Optional_payload_base<FSChaCha20>._M_payload;
  if (uVar5 != 0) {
    pp_Var4 = (this->super_Transport)._vptr_Transport;
    bVar2 = *(byte *)pp_Var4;
    pp_Var4 = (_func_int **)((long)pp_Var4 + 1);
    (this->super_Transport)._vptr_Transport = pp_Var4;
    *(ulong *)&(this->m_cipher).m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>.
               _M_payload.super__Optional_payload<FSChaCha20,_true,_false,_false>.
               super__Optional_payload_base<FSChaCha20>._M_payload = uVar5 - 1;
    if (bVar2 == 0) {
      if (0xc < uVar5) {
        uVar5 = 0;
        do {
          if (*(byte *)((long)pp_Var4 + uVar5) == 0) goto LAB_008ccafb;
          if ((char)*(byte *)((long)pp_Var4 + uVar5) < ' ') goto LAB_008ccab6;
          uVar5 = uVar5 + 1;
        } while (uVar5 != 0xc);
        uVar5 = 0xc;
LAB_008ccafb:
        local_48 = &local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,pp_Var4,(byte *)((long)pp_Var4 + uVar5));
        if (uVar5 < 0xc) {
          do {
            if (*(char *)((long)(this->super_Transport)._vptr_Transport + uVar5) != '\0') {
              bVar3 = false;
              goto LAB_008ccb78;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != 0xc);
        }
        (this->super_Transport)._vptr_Transport =
             (_func_int **)((long)(this->super_Transport)._vptr_Transport + 0xc);
        *(long *)&(this->m_cipher).m_send_l_cipher.super__Optional_base<FSChaCha20,_false,_false>.
                  _M_payload.super__Optional_payload<FSChaCha20,_true,_false,_false>.
                  super__Optional_payload_base<FSChaCha20>._M_payload =
             *(long *)&(this->m_cipher).m_send_l_cipher.
                       super__Optional_base<FSChaCha20,_false,_false>._M_payload.
                       super__Optional_payload<FSChaCha20,_true,_false,_false>.
                       super__Optional_payload_base<FSChaCha20>._M_payload + -0xc;
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload = puVar1;
        if (local_48 == &local_38) {
          *puVar1 = CONCAT71(uStack_37,local_38);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x18) = uStack_30;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload = local_48;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10) = CONCAT71(uStack_37,local_38);
        }
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_string_length = local_40;
        local_40 = 0;
        local_38 = 0;
        bVar3 = true;
        local_48 = &local_38;
LAB_008ccb78:
        (__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = bVar3;
        if (local_48 != &local_38) {
          operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
        }
        goto LAB_008ccaba;
      }
    }
    else if (bVar2 < 0x21) {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (pointer)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,
                 *(long *)((anonymous_namespace)::V2_MESSAGE_IDS_abi_cxx11_ + (ulong)bVar2 * 0x20),
                 *(long *)((anonymous_namespace)::V2_MESSAGE_IDS_abi_cxx11_ +
                          (ulong)bVar2 * 0x20 + 8) +
                 *(long *)((anonymous_namespace)::V2_MESSAGE_IDS_abi_cxx11_ + (ulong)bVar2 * 0x20));
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = true;
      goto LAB_008ccaba;
    }
  }
LAB_008ccab6:
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
LAB_008ccaba:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> V2Transport::GetMessageType(Span<const uint8_t>& contents) noexcept
{
    if (contents.size() == 0) return std::nullopt; // Empty contents
    uint8_t first_byte = contents[0];
    contents = contents.subspan(1); // Strip first byte.

    if (first_byte != 0) {
        // Short (1 byte) encoding.
        if (first_byte < std::size(V2_MESSAGE_IDS)) {
            // Valid short message id.
            return V2_MESSAGE_IDS[first_byte];
        } else {
            // Unknown short message id.
            return std::nullopt;
        }
    }

    if (contents.size() < CMessageHeader::COMMAND_SIZE) {
        return std::nullopt; // Long encoding needs 12 message type bytes.
    }

    size_t msg_type_len{0};
    while (msg_type_len < CMessageHeader::COMMAND_SIZE && contents[msg_type_len] != 0) {
        // Verify that message type bytes before the first 0x00 are in range.
        if (contents[msg_type_len] < ' ' || contents[msg_type_len] > 0x7F) {
            return {};
        }
        ++msg_type_len;
    }
    std::string ret{reinterpret_cast<const char*>(contents.data()), msg_type_len};
    while (msg_type_len < CMessageHeader::COMMAND_SIZE) {
        // Verify that message type bytes after the first 0x00 are also 0x00.
        if (contents[msg_type_len] != 0) return {};
        ++msg_type_len;
    }
    // Strip message type bytes of contents.
    contents = contents.subspan(CMessageHeader::COMMAND_SIZE);
    return ret;
}